

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_user_exception_ls(sexp ctx,sexp self,char *msg,int n,...)

{
  sexp psVar1;
  char in_AL;
  sexp *ppsVar2;
  sexp psVar3;
  ulong uVar4;
  sexp_gc_var_t *n_00;
  sexp_gc_var_t *extraout_RDX;
  sexp in_R8;
  sexp in_R9;
  sexp_tag_t in_XMM0_Da;
  sexp in_XMM1_Qa;
  sexp_proc2 in_XMM2_Qa;
  sexp_conflict *in_XMM3_Qa;
  sexp_conflict *in_XMM4_Qa;
  sexp_mark_stack_ptr_t *in_XMM5_Qa;
  sexp_conflict *in_XMM6_Qa;
  sexp_conflict *in_XMM7_Qa;
  sexp ir;
  sexp res;
  va_list ap;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_128;
  undefined8 local_120;
  ulong local_118;
  sexp *local_110;
  sexp_gc_var_t **local_108;
  undefined8 *local_f8;
  undefined1 auStack_f0 [24];
  sexp_gc_var_t *local_d8 [23];
  
  auStack_f0._8_8_ = &local_128;
  local_108 = local_d8;
  if (in_AL != '\0') {
    local_d8[6]._0_4_ = in_XMM0_Da;
    local_d8[8] = (sexp_gc_var_t *)in_XMM1_Qa;
    local_d8[10] = (sexp_gc_var_t *)in_XMM2_Qa;
    local_d8[0xc] = (sexp_gc_var_t *)in_XMM3_Qa;
    local_d8[0xe] = (sexp_gc_var_t *)in_XMM4_Qa;
    local_d8[0x10] = (sexp_gc_var_t *)in_XMM5_Qa;
    local_d8[0x12] = (sexp_gc_var_t *)in_XMM6_Qa;
    local_d8[0x14] = (sexp_gc_var_t *)in_XMM7_Qa;
  }
  local_f8 = &local_120;
  local_120 = 0x43e;
  psVar3 = (sexp)&local_f8;
  n_00 = (ctx->value).context.saves;
  (ctx->value).context.saves = (sexp_gc_var_t *)psVar3;
  (ctx->value).context.saves = (sexp_gc_var_t *)(auStack_f0 + 8);
  local_110 = &res;
  local_118 = 0x3000000020;
  local_128 = (sexp)&DAT_0000023e;
  auStack_f0._0_8_ = n_00;
  psVar1 = (sexp)&local_128;
  auStack_f0._16_8_ = psVar3;
  local_d8[4] = (sexp_gc_var_t *)in_R8;
  local_d8[5] = (sexp_gc_var_t *)in_R9;
  if (0 < n) {
    do {
      uVar4 = local_118 & 0xffffffff;
      if (uVar4 < 0x29) {
        local_118 = CONCAT44(local_118._4_4_,(int)local_118 + 8);
        ppsVar2 = (sexp *)((long)local_108 + uVar4);
      }
      else {
        ppsVar2 = local_110;
        local_110 = local_110 + 1;
      }
      local_128 = sexp_cons_op(ctx,psVar3,(sexp_sint_t)n_00,*ppsVar2,local_128);
      n = n + -1;
      n_00 = extraout_RDX;
      psVar1 = (sexp)auStack_f0._8_8_;
    } while (n != 0);
  }
  auStack_f0._8_8_ = psVar1;
  local_128 = sexp_nreverse_op(ctx,(sexp)0x0,(sexp_sint_t)n_00,local_128);
  psVar3 = sexp_user_exception(ctx,self,msg,local_128);
  (ctx->value).context.saves = (sexp_gc_var_t *)auStack_f0._0_8_;
  return psVar3;
}

Assistant:

sexp sexp_user_exception_ls (sexp ctx, sexp self, const char *msg, int n, ...) {
  int i;
  va_list ap;
  sexp_gc_var2(res, ir);
  sexp_gc_preserve2(ctx, res, ir);
  va_start(ap, n);
  for (i=0, ir=SEXP_NULL; i < n; ++i) {
    ir = sexp_cons(ctx, va_arg(ap, sexp), ir);
  }
  ir = sexp_nreverse(ctx, ir);
  res = sexp_user_exception(ctx, self, msg, ir);
  sexp_gc_release2(ctx);
  va_end(ap);
  return res;
}